

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiFab_*,_3> *a_facecent,Geometry *geom)

{
  int iVar1;
  int ncomp;
  FabArray<amrex::FArrayBox> *this_00;
  int idim;
  long lVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  IntVect local_54;
  Periodicity local_48;
  IntVect local_3c;
  
  lVar2 = 0;
  do {
    pFVar3 = &a_facecent->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar3,0.0,0,(pFVar3->super_FabArrayBase).n_comp,&(pFVar3->super_FabArrayBase).n_grow
              );
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (this->m_allregular == false) {
    pFVar3 = (FabArray<amrex::FArrayBox> *)&this->m_facecent;
    lVar2 = 0;
    do {
      this_00 = &a_facecent->_M_elems[lVar2]->super_FabArray<amrex::FArrayBox>;
      iVar1 = (this_00->super_FabArrayBase).n_grow.vect[0];
      ncomp = (this_00->super_FabArrayBase).n_comp;
      local_48 = Geometry::periodicity(geom);
      local_3c.vect[0] = 0;
      local_3c.vect[1] = 0;
      local_3c.vect[2] = 0;
      local_54.vect[0] = iVar1;
      local_54.vect[1] = iVar1;
      local_54.vect[2] = iVar1;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (this_00,pFVar3,0,0,ncomp,&local_3c,&local_54,&local_48,COPY,(CPC *)0x0,false);
      lVar2 = lVar2 + 1;
      pFVar3 = pFVar3 + 1;
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_facecent[idim]->setVal(0.0);
    }
    if (!isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            auto& facecent = *a_facecent[idim];
            a_facecent[idim]->ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                                           0,facecent.nGrow(),geom.periodicity());
        }
    }
}